

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi,void **scanResults,int *count)

{
  PaUtilAllocationGroup *pPVar1;
  char *pcVar2;
  PaDeviceInfo **deviceInfos;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  void **ppvVar7;
  byte *pbVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  byte *pbVar16;
  byte *pbVar17;
  snd_config_t *psVar18;
  snd_config_t *psVar19;
  snd_config_t *psVar20;
  undefined8 uVar21;
  void *pvVar22;
  PaAlsaDeviceInfo *pPVar23;
  pthread_t pVar24;
  long lVar25;
  char **ppcVar26;
  char *pcVar27;
  char *pcVar28;
  byte bVar29;
  byte *pbVar30;
  char *pcVar31;
  snd_ctl_t *psVar32;
  HwDevInfo *pHVar33;
  char *pcVar34;
  PaError PVar35;
  int __pa_unsure_error_id;
  bool bVar36;
  ulong uStack_150;
  char local_148 [8];
  char alsaCardName [50];
  char *local_108;
  char buf [67];
  char *local_b8;
  char *alsaDeviceName;
  int *local_a8;
  void **local_a0;
  char *local_98;
  undefined8 local_90;
  snd_config_t *topNode;
  undefined8 uStack_80;
  int local_78;
  uint local_74;
  int local_70;
  uint local_6c;
  int devIdx_1;
  undefined8 local_60;
  snd_ctl_t *ctl;
  byte *local_50;
  char *cardName;
  int local_3c;
  HwDevInfo *pHStack_38;
  int devIdx;
  
  local_3c = 0;
  local_90 = 0;
  uStack_150 = 0x11304b;
  pcVar13 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar13 == (char *)0x0) {
    local_6c = 1;
  }
  else {
    uStack_150 = 0x113058;
    iVar9 = atoi(pcVar13);
    local_6c = (uint)(iVar9 == 0);
  }
  uStack_150 = 0x113076;
  pcVar13 = getenv("PA_ALSA_PLUGHW");
  local_a8 = count;
  local_a0 = scanResults;
  if (pcVar13 == (char *)0x0) {
    local_74 = 0;
    ctl = (snd_ctl_t *)0x119e30;
  }
  else {
    uStack_150 = 0x113091;
    iVar9 = atoi(pcVar13);
    local_74 = (uint)(iVar9 != 0);
    ctl = (snd_ctl_t *)0x119e30;
    if (iVar9 != 0) {
      ctl = (snd_ctl_t *)"plug";
    }
  }
  local_78 = -1;
  uStack_150 = 0x1130d1;
  sVar14 = snd_ctl_card_info_sizeof();
  lVar4 = -(sVar14 + 0xf & 0xfffffffffffffff0);
  pcVar31 = local_148 + lVar4;
  pcVar27 = local_148 + lVar4 + -8;
  alsaDeviceName = pcVar31;
  pcVar27[0] = -0xd;
  pcVar27[1] = '0';
  pcVar27[2] = '\x11';
  pcVar27[3] = '\0';
  pcVar27[4] = '\0';
  pcVar27[5] = '\0';
  pcVar27[6] = '\0';
  pcVar27[7] = '\0';
  memset(pcVar31,0,sVar14);
  pcVar28 = local_148 + lVar4 + -8;
  pcVar28[0] = -8;
  pcVar28[1] = '0';
  pcVar28[2] = '\x11';
  pcVar28[3] = '\0';
  pcVar28[4] = '\0';
  pcVar28[5] = '\0';
  pcVar28[6] = '\0';
  pcVar28[7] = '\0';
  sVar14 = snd_pcm_info_sizeof();
  lVar5 = -(sVar14 + 0xf & 0xfffffffffffffff0);
  pcVar31 = pcVar31 + lVar5;
  builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"\x161\x11",4);
  pcVar31[-4] = '\0';
  pcVar31[-3] = '\0';
  pcVar31[-2] = '\0';
  pcVar31[-1] = '\0';
  memset(pcVar31,0,sVar14);
  pcVar31[-8] = '\x01';
  pcVar31[-7] = '\0';
  pcVar31[-6] = '\0';
  pcVar31[-5] = '\0';
  pcVar31[-4] = '\0';
  pcVar31[-3] = '\0';
  pcVar31[-2] = '\0';
  pcVar31[-1] = '\0';
  _devIdx_1 = *(char **)(pcVar31 + -8);
  pHStack_38 = (HwDevInfo *)0x0;
  pcVar34 = (char *)0x0;
  pcVar13 = pcVar31;
  local_98 = pcVar31;
  cardName = (char *)alsaApi;
  while( true ) {
    builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"C1\x11",4);
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    iVar9 = snd_card_next(&local_78);
    if ((iVar9 != 0) || (local_78 < 0)) break;
    local_70 = -1;
    pcVar31[-8] = '2';
    pcVar31[-7] = '\0';
    pcVar31[-6] = '\0';
    pcVar31[-5] = '\0';
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"u1\x11",4);
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    snprintf(local_148,*(size_t *)(pcVar31 + -8),"hw:%d");
    pcVar31[-8] = -0x7d;
    pcVar31[-7] = '1';
    pcVar31[-6] = '\x11';
    pcVar31[-5] = '\0';
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    iVar9 = snd_ctl_open(&local_60,local_148,0);
    uVar3 = local_60;
    pcVar15 = alsaDeviceName;
    if (-1 < iVar9) {
      pcVar31[-8] = -0x66;
      pcVar31[-7] = '1';
      pcVar31[-6] = '\x11';
      pcVar31[-5] = '\0';
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      snd_ctl_card_info(uVar3,pcVar15);
      pcVar31[-8] = -0x5e;
      pcVar31[-7] = '1';
      pcVar31[-6] = '\x11';
      pcVar31[-5] = '\0';
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      pcVar15 = (char *)snd_ctl_card_info_get_name(pcVar15);
      pcVar31[-8] = -0x4f;
      pcVar31[-7] = '1';
      pcVar31[-6] = '\x11';
      pcVar31[-5] = '\0';
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      paUtilErr_ = PaAlsa_StrDup(alsaApi,(char **)&local_50,pcVar15);
      if (paUtilErr_ < 0) goto LAB_00113943;
      while( true ) {
        uVar3 = local_60;
        pcVar31[-8] = -0x34;
        pcVar31[-7] = '1';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        iVar9 = snd_ctl_pcm_next_device(uVar3,&local_70);
        uVar3 = local_60;
        if ((iVar9 != 0) || (local_70 < 0)) break;
        pcVar31[-8] = 'C';
        psVar32 = ctl;
        pcVar31[-7] = '\0';
        pcVar31[-6] = '\0';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        sVar14 = *(size_t *)(pcVar31 + -8);
        pcVar31[-8] = '\0';
        pcVar31[-7] = '2';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        snprintf((char *)&local_108,sVar14,"%s%s,%d",psVar32,local_148);
        iVar9 = local_70;
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"\v2\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        snd_pcm_info_set_device(pcVar13,iVar9);
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"\x152\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        snd_pcm_info_set_subdevice(pcVar13,0);
        pcVar31[-8] = '\x01';
        pcVar31[-7] = '\0';
        pcVar31[-6] = '\0';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8," 2\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        snd_pcm_info_set_stream(pcVar13,*(undefined8 *)(pcVar31 + -8));
        uVar3 = local_60;
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,",2\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        uVar10 = snd_ctl_pcm_info(uVar3,pcVar13);
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"82\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        snd_pcm_info_set_stream(pcVar13,0);
        uVar3 = local_60;
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"D2\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        uVar11 = snd_ctl_pcm_info(uVar3,pcVar13);
        if (-1 < (int)(uVar11 & uVar10)) {
          topNode = (snd_config_t *)CONCAT44(uVar10,uVar11);
          uStack_80 = 0;
          builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"e2\x11",4);
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          pbVar16 = (byte *)snd_pcm_info_get_name();
          pbVar8 = local_50;
          pbVar30 = local_50;
LAB_00113273:
          bVar29 = *pbVar16;
          pbVar17 = pbVar16;
          if (*pbVar30 != 0) {
            while ((bVar29 != 0 && (bVar29 == *pbVar30))) {
              pbVar30 = pbVar30 + 1;
              bVar29 = pbVar17[1];
              pbVar17 = pbVar17 + 1;
              if ((bVar29 & 0xdf) == 0) {
                pbVar16 = pbVar17;
              }
            }
            do {
              bVar29 = *pbVar30;
              if (bVar29 == 0) break;
              pbVar30 = pbVar30 + 1;
            } while (bVar29 != 0x20);
            goto LAB_00113273;
          }
          pbVar30 = (byte *)"-";
          if (bVar29 != 0) {
            while (bVar29 == 0x20) {
              pbVar30 = pbVar16 + 1;
              pbVar16 = pbVar16 + 1;
              bVar29 = *pbVar30;
            }
            if ((bVar29 == 0x2d) || (pbVar30 = pbVar16, bVar29 == 0x3a)) {
              pbVar30 = pbVar16 + (ulong)(pbVar16[1] == 0x20) * 2;
            }
          }
          pcVar31[-8] = -2;
          pcVar31[-7] = '2';
          pcVar31[-6] = '\x11';
          pcVar31[-5] = '\0';
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          iVar9 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar8,pbVar30,&local_108);
          pPVar1 = *(PaUtilAllocationGroup **)(cardName + 0x120);
          builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"\x193\x11",4);
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          pcVar15 = (char *)PaUtil_GroupAllocateMemory(pPVar1,(long)(iVar9 + 1));
          pbVar8 = local_50;
          if (pcVar15 == (char *)0x0) {
            pcVar13 = 
            "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1365\n"
            ;
            goto LAB_0011393c;
          }
          builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"C3\x11",4);
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          snprintf(pcVar15,(long)(iVar9 + 1),"%s: %s (%s)",pbVar8,pbVar30,&local_108);
          pHVar33 = pHStack_38;
          pcVar13 = _devIdx_1;
          if (_devIdx_1 < pcVar34 + 1 || pHStack_38 == (HwDevInfo *)0x0) {
            sVar14 = (long)_devIdx_1 << 6;
            builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"r3\x11",4);
            pcVar31[-4] = '\0';
            pcVar31[-3] = '\0';
            pcVar31[-2] = '\0';
            pcVar31[-1] = '\0';
            pHStack_38 = (HwDevInfo *)realloc(pHVar33,sVar14);
            if (pHStack_38 == (HwDevInfo *)0x0) {
              pcVar13 = 
              "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1375\n"
              ;
              goto LAB_0011393c;
            }
            _devIdx_1 = (char *)((long)pcVar13 * 2);
          }
          alsaApi = (PaAlsaHostApiRepresentation *)cardName;
          pcVar13 = local_98;
          pcVar31[-8] = -0x49;
          pcVar31[-7] = '3';
          pcVar31[-6] = '\x11';
          pcVar31[-5] = '\0';
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          paUtilErr_ = PaAlsa_StrDup(alsaApi,&local_b8,(char *)&local_108);
          if (paUtilErr_ < 0) {
            pcVar13 = 
            "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1378\n"
            ;
            goto LAB_0011393c;
          }
          pHStack_38[(long)pcVar34].alsaName = local_b8;
          pHStack_38[(long)pcVar34].name = pcVar15;
          pHStack_38[(long)pcVar34].isPlug = local_74;
          pHStack_38[(long)pcVar34].hasPlayback = -(uint)(-1 < (int)topNode) >> 0x1f;
          pHStack_38[(long)pcVar34].hasCapture = -(uint)(-1 < (long)topNode) >> 0x1f;
          pcVar34 = pcVar34 + 1;
        }
      }
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"\x164\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      snd_ctl_close(uVar3);
      pbVar8 = local_50;
      pPVar1 = alsaApi->allocations;
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"&4\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      PaUtil_GroupFreeMemory(pPVar1,pbVar8);
    }
  }
  if (_snd_config == 0) {
    builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"?4\x11",4);
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    iVar9 = snd_config_update();
    if (iVar9 < 0) {
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"::\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      pVar24 = pthread_self();
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"L:\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      iVar12 = pthread_equal(pVar24,paUnixMainThread);
      if (iVar12 != 0) {
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"Z:\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        pcVar13 = (char *)snd_strerror(iVar9);
        pcVar31[-8] = '\b';
        pcVar31[-7] = '\0';
        pcVar31[-6] = '\0';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"h:\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        PaUtil_SetLastHostErrorInfo
                  ((PaHostApiTypeId)*(undefined8 *)(pcVar31 + -8),(long)iVar9,pcVar13);
      }
      pcVar13 = 
      "Expression \'alsa_snd_config_update()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1394\n"
      ;
LAB_0011393c:
      do {
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"C9\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        PaUtil_DebugPrint(pcVar13);
LAB_00113943:
        pcVar13 = 
        "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1329\n"
        ;
      } while( true );
    }
    if (_snd_config == 0) {
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"#9\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      __assert_fail("*alsa_snd_config",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x575,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *, void **, int *)")
      ;
    }
  }
  builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"f4\x11",4);
  pcVar31[-4] = '\0';
  pcVar31[-3] = '\0';
  pcVar31[-2] = '\0';
  pcVar31[-1] = '\0';
  iVar9 = snd_config_search(_snd_config,"pcm",&local_90);
  uVar3 = local_90;
  if (-1 < iVar9) {
    builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"z4\x11",4);
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    psVar18 = (snd_config_t *)snd_config_iterator_first(uVar3);
    ctl = (snd_ctl_t *)paHostApiInitializers;
LAB_00113497:
    pcVar31[-8] = -0x5d;
    pcVar31[-7] = '4';
    pcVar31[-6] = '\x11';
    pcVar31[-5] = '\0';
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    psVar19 = (snd_config_t *)snd_config_iterator_next(psVar18);
    uVar3 = local_90;
    pcVar31[-8] = -0x4e;
    pcVar31[-7] = '4';
    pcVar31[-6] = '\x11';
    pcVar31[-5] = '\0';
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    psVar20 = (snd_config_t *)snd_config_iterator_end(uVar3);
    alsaApi = (PaAlsaHostApiRepresentation *)cardName;
    if (psVar18 != psVar20) {
      local_108 = "unknown";
      local_50 = (byte *)0x0;
      pcVar31[-8] = -0x31;
      pcVar31[-7] = '4';
      pcVar31[-6] = '\x11';
      pcVar31[-5] = '\0';
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      uVar21 = snd_config_iterator_entry(psVar18);
      local_60 = 0;
      pcVar31[-8] = -0x16;
      pcVar31[-7] = '4';
      pcVar31[-6] = '\x11';
      pcVar31[-5] = '\0';
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      iVar9 = snd_config_search(uVar21,"type",&local_60);
      uVar3 = local_60;
      if (iVar9 < 0) {
        if (iVar9 != -2) {
          pcVar31[-8] = -0x2c;
          pcVar31[-7] = '9';
          pcVar31[-6] = '\x11';
          pcVar31[-5] = '\0';
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          pVar24 = pthread_self();
          pcVar31[-8] = -0x1a;
          pcVar31[-7] = '9';
          pcVar31[-6] = '\x11';
          pcVar31[-5] = '\0';
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          iVar12 = pthread_equal(pVar24,paUnixMainThread);
          if (iVar12 != 0) {
            pcVar31[-8] = -0xb;
            pcVar31[-7] = '9';
            pcVar31[-6] = '\x11';
            pcVar31[-5] = '\0';
            pcVar31[-4] = '\0';
            pcVar31[-3] = '\0';
            pcVar31[-2] = '\0';
            pcVar31[-1] = '\0';
            pcVar13 = (char *)snd_strerror(iVar9);
            pcVar31[-8] = '\b';
            pcVar31[-7] = '\0';
            pcVar31[-6] = '\0';
            pcVar31[-5] = '\0';
            pcVar31[-4] = '\0';
            pcVar31[-3] = '\0';
            pcVar31[-2] = '\0';
            pcVar31[-1] = '\0';
            builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"\x03:\x11",4);
            pcVar31[-4] = '\0';
            pcVar31[-3] = '\0';
            pcVar31[-2] = '\0';
            pcVar31[-1] = '\0';
            PaUtil_SetLastHostErrorInfo
                      ((PaHostApiTypeId)*(undefined8 *)(pcVar31 + -8),(long)iVar9,pcVar13);
          }
          pcVar13 = 
          "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1415\n"
          ;
          goto LAB_0011393c;
        }
      }
      else {
        pcVar31[-8] = -2;
        pcVar31[-7] = '4';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        iVar9 = snd_config_get_string(uVar3,&local_108);
        if (iVar9 < 0) {
          pcVar31[-8] = -0x6c;
          pcVar31[-7] = '9';
          pcVar31[-6] = '\x11';
          pcVar31[-5] = '\0';
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          pVar24 = pthread_self();
          pcVar31[-8] = -0x5a;
          pcVar31[-7] = '9';
          pcVar31[-6] = '\x11';
          pcVar31[-5] = '\0';
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          iVar12 = pthread_equal(pVar24,paUnixMainThread);
          if (iVar12 != 0) {
            pcVar31[-8] = -0x4b;
            pcVar31[-7] = '9';
            pcVar31[-6] = '\x11';
            pcVar31[-5] = '\0';
            pcVar31[-4] = '\0';
            pcVar31[-3] = '\0';
            pcVar31[-2] = '\0';
            pcVar31[-1] = '\0';
            pcVar13 = (char *)snd_strerror(iVar9);
            pcVar31[-8] = '\b';
            pcVar31[-7] = '\0';
            pcVar31[-6] = '\0';
            pcVar31[-5] = '\0';
            pcVar31[-4] = '\0';
            pcVar31[-3] = '\0';
            pcVar31[-2] = '\0';
            pcVar31[-1] = '\0';
            uVar3 = *(undefined8 *)(pcVar31 + -8);
            pcVar31[-8] = -0x3d;
            pcVar31[-7] = '9';
            pcVar31[-6] = '\x11';
            pcVar31[-5] = '\0';
            pcVar31[-4] = '\0';
            pcVar31[-3] = '\0';
            pcVar31[-2] = '\0';
            pcVar31[-1] = '\0';
            PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar9,pcVar13);
          }
          pcVar13 = 
          "Expression \'alsa_snd_config_get_string( tp, &tpStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1420\n"
          ;
          goto LAB_0011393c;
        }
      }
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"\x1f5\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      iVar9 = snd_config_get_id(uVar21,&local_50);
      pbVar8 = local_50;
      if (-1 < iVar9) {
        topNode = psVar19;
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,";5\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        pcVar15 = getenv("PA_ALSA_IGNORE_ALL_PLUGINS");
        pcVar13 = cardName;
        if (pcVar15 != (char *)0x0) goto code_r0x00113544;
        goto LAB_00113550;
      }
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"T9\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      pVar24 = pthread_self();
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"f9\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      iVar12 = pthread_equal(pVar24,paUnixMainThread);
      if (iVar12 != 0) {
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"u9\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        pcVar13 = (char *)snd_strerror(iVar9);
        pcVar31[-8] = '\b';
        pcVar31[-7] = '\0';
        pcVar31[-6] = '\0';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        uVar3 = *(undefined8 *)(pcVar31 + -8);
        pcVar31[-8] = -0x7d;
        pcVar31[-7] = '9';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        PaUtil_SetLastHostErrorInfo((PaHostApiTypeId)uVar3,(long)iVar9,pcVar13);
      }
      pcVar13 = 
      "Expression \'alsa_snd_config_get_id( n, &idStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1422\n"
      ;
      goto LAB_0011393c;
    }
  }
  pPVar1 = alsaApi->allocations;
  pcVar31[-8] = '\x18';
  pcVar31[-7] = '\0';
  pcVar31[-6] = '\0';
  pcVar31[-5] = '\0';
  pcVar31[-4] = '\0';
  pcVar31[-3] = '\0';
  pcVar31[-2] = '\0';
  pcVar31[-1] = '\0';
  lVar25 = *(long *)(pcVar31 + -8);
  pcVar31[-8] = -0x57;
  pcVar31[-7] = '6';
  pcVar31[-6] = '\x11';
  pcVar31[-5] = '\0';
  pcVar31[-4] = '\0';
  pcVar31[-3] = '\0';
  pcVar31[-2] = '\0';
  pcVar31[-1] = '\0';
  psVar18 = (snd_config_t *)PaUtil_GroupAllocateMemory(pPVar1,lVar25);
  *(undefined8 *)(psVar18 + 8) = 0xffffffffffffffff;
  pPVar1 = alsaApi->allocations;
  pcVar31[-8] = -0x3b;
  pcVar31[-7] = '6';
  pcVar31[-6] = '\x11';
  pcVar31[-5] = '\0';
  pcVar31[-4] = '\0';
  pcVar31[-3] = '\0';
  pcVar31[-2] = '\0';
  pcVar31[-1] = '\0';
  pvVar22 = PaUtil_GroupAllocateMemory(pPVar1,(long)pcVar34 * 8);
  *(void **)psVar18 = pvVar22;
  topNode = psVar18;
  if (pvVar22 == (void *)0x0) {
    pcVar31[-8] = -0x41;
    pcVar31[-7] = '8';
    pcVar31[-6] = '\x11';
    pcVar31[-5] = '\0';
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    PaUtil_DebugPrint(
                     "Expression \'out->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1474\n"
                     );
    PVar35 = -0x2708;
  }
  else {
    pPVar1 = alsaApi->allocations;
    pcVar31[-8] = -0x1b;
    pcVar31[-7] = '6';
    pcVar31[-6] = '\x11';
    pcVar31[-5] = '\0';
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    pPVar23 = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar1,(long)pcVar34 * 0x70);
    if (pPVar23 != (PaAlsaDeviceInfo *)0x0) {
      local_3c = 0;
      _devIdx_1 = 
      "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1498\n"
      ;
      pHVar33 = pHStack_38;
      pcVar13 = pcVar34;
      ctl = (snd_ctl_t *)pPVar23;
      while (bVar36 = pcVar13 != (char *)0x0, pcVar13 = pcVar13 + -1, bVar36) {
        pcVar15 = pHVar33->name;
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"(7\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        iVar9 = strcmp(pcVar15,"dmix");
        if (iVar9 != 0) {
          builtin_strncpy(local_148 + lVar5 + lVar4 + -8,";7\x11",4);
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          iVar9 = strcmp(pcVar15,"default");
          pcVar15 = cardName;
          uVar10 = local_6c;
          psVar18 = topNode;
          if (iVar9 != 0) {
            builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"Y7\x11",4);
            pcVar31[-4] = '\0';
            pcVar31[-3] = '\0';
            pcVar31[-2] = '\0';
            pcVar31[-1] = '\0';
            paUtilErr_ = FillInDevInfo((PaAlsaHostApiRepresentation *)pcVar15,pHVar33,uVar10,pPVar23
                                       ,&local_3c,(PaLinuxScanDeviceInfosResults *)psVar18);
            if (paUtilErr_ < 0) goto LAB_0011387f;
          }
        }
        pPVar23 = pPVar23 + 1;
        pHVar33 = pHVar33 + 1;
      }
      if (pcVar34 < (char *)(long)local_3c) {
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"\x049\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        __assert_fail("devIdx <= numDeviceNames",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x5dc,
                      "PaError BuildDeviceList(PaAlsaHostApiRepresentation *, void **, int *)");
      }
      _devIdx_1 = 
      "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1511\n"
      ;
      pcVar13 = pcVar34;
      pPVar23 = (PaAlsaDeviceInfo *)ctl;
      pHVar33 = pHStack_38;
      while (alsaApi = (PaAlsaHostApiRepresentation *)cardName, ppvVar7 = local_a0,
            piVar6 = local_a8, bVar36 = pcVar13 != (char *)0x0, pcVar13 = pcVar13 + -1, bVar36) {
        pcVar15 = pHVar33->name;
        pcVar31[-8] = -0x53;
        pcVar31[-7] = '7';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        iVar9 = strcmp(pcVar15,"dmix");
        if (iVar9 == 0) {
LAB_001137c4:
          pcVar15 = cardName;
          uVar10 = local_6c;
          psVar18 = topNode;
          pcVar31[-8] = -0x22;
          pcVar31[-7] = '7';
          pcVar31[-6] = '\x11';
          pcVar31[-5] = '\0';
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          paUtilErr_ = FillInDevInfo((PaAlsaHostApiRepresentation *)pcVar15,pHVar33,uVar10,pPVar23,
                                     &local_3c,(PaLinuxScanDeviceInfosResults *)psVar18);
          if (paUtilErr_ < 0) goto LAB_0011387f;
        }
        else {
          pcVar31[-8] = -0x40;
          pcVar31[-7] = '7';
          pcVar31[-6] = '\x11';
          pcVar31[-5] = '\0';
          pcVar31[-4] = '\0';
          pcVar31[-3] = '\0';
          pcVar31[-2] = '\0';
          pcVar31[-1] = '\0';
          iVar9 = strcmp(pcVar15,"default");
          if (iVar9 == 0) goto LAB_001137c4;
        }
        pPVar23 = pPVar23 + 1;
        pHVar33 = pHVar33 + 1;
      }
      ppcVar26 = &pHStack_38->name;
      while (pHVar33 = pHStack_38, bVar36 = pcVar34 != (char *)0x0, pcVar34 = pcVar34 + -1, bVar36)
      {
        pPVar1 = *(PaUtilAllocationGroup **)((long)alsaApi + 0x120);
        pcVar13 = *ppcVar26;
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"%8\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        PaUtil_GroupFreeMemory(pPVar1,pcVar13);
        pPVar1 = *(PaUtilAllocationGroup **)((long)alsaApi + 0x120);
        pcVar13 = ((HwDevInfo *)(ppcVar26 + -1))->alsaName;
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"58\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        PaUtil_GroupFreeMemory(pPVar1,pcVar13);
        ppcVar26 = ppcVar26 + 4;
      }
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"D8\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      free(pHVar33);
      *(int *)(topNode + 0x10) = local_3c;
      *ppvVar7 = topNode;
      *piVar6 = local_3c;
      PVar35 = 0;
      goto LAB_00113858;
    }
    ctl = (snd_ctl_t *)0x0;
    pcVar31[-8] = -0x23;
    pcVar31[-7] = '8';
    pcVar31[-6] = '\x11';
    pcVar31[-5] = '\0';
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    PaUtil_DebugPrint(
                     "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1478\n"
                     );
    PVar35 = -0x2708;
  }
LAB_00113895:
  iVar9 = local_3c;
  psVar18 = topNode;
  pPVar1 = alsaApi->allocations;
  deviceInfos = *(PaDeviceInfo ***)topNode;
  pcVar31[-8] = -0x55;
  pcVar31[-7] = '8';
  pcVar31[-6] = '\x11';
  pcVar31[-5] = '\0';
  pcVar31[-4] = '\0';
  pcVar31[-3] = '\0';
  pcVar31[-2] = '\0';
  pcVar31[-1] = '\0';
  FreeDeviceInfos(pPVar1,deviceInfos,iVar9);
  *(undefined8 *)psVar18 = 0;
LAB_00113858:
  psVar32 = ctl;
  if (ctl != (snd_ctl_t *)0x0) {
    pPVar1 = alsaApi->allocations;
    builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"m8\x11",4);
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    PaUtil_GroupFreeMemory(pPVar1,psVar32);
  }
  return PVar35;
code_r0x00113544:
  builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"L5\x11",4);
  pcVar31[-4] = '\0';
  pcVar31[-3] = '\0';
  pcVar31[-2] = '\0';
  pcVar31[-1] = '\0';
  iVar9 = atoi(pcVar15);
  psVar18 = topNode;
  if (iVar9 == 0) {
LAB_00113550:
    lVar25 = 0;
    do {
      if (lVar25 == 0x50) {
        pPVar1 = *(PaUtilAllocationGroup **)(pcVar13 + 0x120);
        pcVar31[-8] = -0x6f;
        pcVar31[-7] = '5';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        sVar14 = strlen((char *)pbVar8);
        pcVar31[-8] = -99;
        pcVar31[-7] = '5';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        pcVar15 = (char *)PaUtil_GroupAllocateMemory(pPVar1,sVar14 + 6);
        pbVar8 = local_50;
        if (pcVar15 == (char *)0x0) {
          pcVar13 = 
          "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1431\n"
          ;
          goto LAB_0011393c;
        }
        pcVar31[-8] = -0x4b;
        pcVar31[-7] = '5';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        strcpy(pcVar15,(char *)pbVar8);
        pbVar8 = local_50;
        pPVar1 = *(PaUtilAllocationGroup **)(pcVar13 + 0x120);
        pcVar31[-8] = -0x3b;
        pcVar31[-7] = '5';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        sVar14 = strlen((char *)pbVar8);
        pcVar31[-8] = -0x2f;
        pcVar31[-7] = '5';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        pcVar13 = (char *)PaUtil_GroupAllocateMemory(pPVar1,sVar14 + 1);
        pbVar8 = local_50;
        if (pcVar13 == (char *)0x0) {
          pcVar13 = 
          "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1434\n"
          ;
          goto LAB_0011393c;
        }
        pcVar31[-8] = -0x17;
        pcVar31[-7] = '5';
        pcVar31[-6] = '\x11';
        pcVar31[-5] = '\0';
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        strcpy(pcVar13,(char *)pbVar8);
        pHVar33 = pHStack_38;
        pcVar2 = _devIdx_1;
        if ((pHStack_38 != (HwDevInfo *)0x0) && (psVar32 = ctl, pcVar34 + 1 <= _devIdx_1))
        goto LAB_00113625;
        sVar14 = (long)_devIdx_1 << 6;
        builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"\r6\x11",4);
        pcVar31[-4] = '\0';
        pcVar31[-3] = '\0';
        pcVar31[-2] = '\0';
        pcVar31[-1] = '\0';
        pHStack_38 = (HwDevInfo *)realloc(pHVar33,sVar14);
        if (pHStack_38 != (HwDevInfo *)0x0) {
          _devIdx_1 = (char *)((long)pcVar2 * 2);
          psVar32 = ctl;
          goto LAB_00113625;
        }
        pcVar13 = 
        "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1442\n"
        ;
        goto LAB_0011393c;
      }
      pcVar15 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar25);
      builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"k5\x11",4);
      pcVar31[-4] = '\0';
      pcVar31[-3] = '\0';
      pcVar31[-2] = '\0';
      pcVar31[-1] = '\0';
      iVar9 = strcmp((char *)pbVar8,pcVar15);
      lVar25 = lVar25 + 8;
      psVar18 = topNode;
    } while (iVar9 != 0);
  }
  goto LAB_00113497;
  while( true ) {
    builtin_strncpy(local_148 + lVar5 + lVar4 + -8,"76\x11",4);
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    iVar9 = strcmp(pcVar15,pcVar2);
    psVar32 = psVar32 + 0x20;
    if (iVar9 == 0) break;
LAB_00113625:
    pcVar2 = *(char **)(psVar32 + 0x20);
    if (pcVar2 == (char *)0x0) {
      psVar32 = (snd_ctl_t *)0x0;
      break;
    }
  }
  pHStack_38[(long)pcVar34].alsaName = pcVar15;
  pHStack_38[(long)pcVar34].name = pcVar13;
  pHStack_38[(long)pcVar34].isPlug = 1;
  if (psVar32 == (snd_ctl_t *)0x0) {
    pHStack_38[(long)pcVar34].hasPlayback = 1;
    pcVar31[-8] = '\x01';
    pcVar31[-7] = '\0';
    pcVar31[-6] = '\0';
    pcVar31[-5] = '\0';
    pcVar31[-4] = '\0';
    pcVar31[-3] = '\0';
    pcVar31[-2] = '\0';
    pcVar31[-1] = '\0';
    iVar9 = (int)*(undefined8 *)(pcVar31 + -8);
  }
  else {
    pHStack_38[(long)pcVar34].hasPlayback = *(int *)(psVar32 + 0x14);
    iVar9 = *(int *)(psVar32 + 0x18);
  }
  pHStack_38[(long)pcVar34].hasCapture = iVar9;
  pcVar34 = pcVar34 + 1;
  psVar18 = topNode;
  goto LAB_00113497;
LAB_0011387f:
  pcVar13 = _devIdx_1;
  pcVar31[-8] = -0x76;
  pcVar31[-7] = '8';
  pcVar31[-6] = '\x11';
  pcVar31[-5] = '\0';
  pcVar31[-4] = '\0';
  pcVar31[-3] = '\0';
  pcVar31[-2] = '\0';
  pcVar31[-1] = '\0';
  PaUtil_DebugPrint(pcVar13);
  alsaApi = (PaAlsaHostApiRepresentation *)cardName;
  PVar35 = paUtilErr_;
  goto LAB_00113895;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi, void** scanResults, int* count)
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif
    PaLinuxScanDeviceInfosResults* out = NULL;

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[67];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            PA_DEBUG(( "%s: Found device [%d]: %s\n", __FUNCTION__, numDeviceNames, deviceName ));

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
        PaUtil_GroupFreeMemory( alsaApi->allocations, cardName );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    out = (PaLinuxScanDeviceInfosResults *) PaUtil_GroupAllocateMemory(
                            alsaApi->allocations, sizeof(PaLinuxScanDeviceInfosResults) );

    out->defaultInputDevice = paNoDevice;
    out->defaultOutputDevice = paNoDevice;

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( out->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out ) );
    }
    assert( devIdx <= numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx, out ) );
    }

    for( i = 0; i < numDeviceNames; ++i )
    {
        HwDevInfo* hwInfo = &hwDevInfos[i];
        PaUtil_GroupFreeMemory( alsaApi->allocations, hwInfo->name );
        PaUtil_GroupFreeMemory( alsaApi->allocations, hwInfo->alsaName );
    }
    free( hwDevInfos );

    out->deviceCount = devIdx;   /* Number of successfully queried devices */
    *scanResults = out;
    *count = out->deviceCount;

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    if( deviceInfoArray )
    {
        PaUtil_GroupFreeMemory( alsaApi->allocations, deviceInfoArray );
    }

    return result;

error:
    if( out )
    {
        FreeDeviceInfos( alsaApi->allocations, out->deviceInfos, devIdx );
        out->deviceInfos = NULL;
    }

    goto end;
}